

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O3

double __thiscall TerminalOutput::log(TerminalOutput *this,double __x)

{
  undefined1 *puVar1;
  FILE *__stream;
  int iVar2;
  int in_ECX;
  undefined8 *puVar3;
  char *in_RDX;
  anon_union_8_2_1a2b307e_for_Flags<LogOutput::LogFlag>_1 *in_RSI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar4;
  anon_union_8_2_1a2b307e_for_Flags<LogOutput::LogFlag>_1 local_38;
  anon_union_8_2_1a2b307e_for_Flags<LogOutput::LogFlag>_1 local_30;
  
  local_30 = (anon_union_8_2_1a2b307e_for_Flags<LogOutput::LogFlag>_1)in_RSI->mValue;
  if ((local_30.mValue & 8U) == 0) {
    puVar3 = (undefined8 *)&stderr;
  }
  else {
    puVar3 = (undefined8 *)&stdout;
  }
  __stream = (FILE *)*puVar3;
  iVar2 = *(int *)&(this->super_LogOutput).field_0x1c;
  if ((local_30.mValue & 4U) == 0) {
    if (iVar2 != 0) {
      fputc(10,__stream);
    }
    *(undefined4 *)&(this->super_LogOutput).field_0x1c = 0;
    local_38.mValue = *(int64_t *)in_RSI;
    writeLog((FILE *)__stream,in_RDX,in_ECX,(Flags<LogOutput::LogFlag> *)&local_38);
    dVar4 = extraout_XMM0_Qa;
    if (((ulong)(this->mFlags).field_0 & 0x20) != 0) {
      fflush(__stream);
      return extraout_XMM0_Qa_00;
    }
  }
  else {
    if (iVar2 != 0) {
      iVar2 = 0xd;
      while( true ) {
        fputc(iVar2,__stream);
        puVar1 = &(this->super_LogOutput).field_0x1c;
        iVar2 = *(int *)puVar1;
        *(int *)puVar1 = *(int *)puVar1 + -1;
        if (iVar2 == 0) break;
        iVar2 = 0x20;
      }
      fputc(0xd,__stream);
      local_30.mValue = *(int64_t *)in_RSI;
    }
    iVar2 = writeLog((FILE *)__stream,in_RDX,in_ECX,(Flags<LogOutput::LogFlag> *)&local_30);
    *(int *)&(this->super_LogOutput).field_0x1c = iVar2;
    dVar4 = extraout_XMM0_Qa_01;
  }
  return dVar4;
}

Assistant:

virtual void log(Flags<LogOutput::LogFlag> flags, const char *msg, int len) override
    {
        FILE *f = flags & StdOut ? stdout : stderr;
        if (flags & Replaceable) {
            if (mReplaceableLength) {
                fwrite("\r", 1, 1, f);
                while (mReplaceableLength--)
                    fwrite(" ", 1, 1, f);
                fwrite("\r", 1, 1, f);
            }
            mReplaceableLength = writeLog(f, msg, len, flags);
        } else {
            if (mReplaceableLength)
                fwrite("\n", 1, 1, f);
            mReplaceableLength = 0;
            writeLog(f, msg, len, flags);
            if (mFlags & ::LogFlush) {
                fflush(f);
            }
        }
    }